

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int stbi_jpeg_test_memory(stbi_uc *buffer,int len)

{
  int iVar1;
  undefined1 local_3728 [8];
  jpeg j;
  int len_local;
  stbi_uc *buffer_local;
  
  j._14092_4_ = len;
  start_mem((stbi *)local_3728,buffer,len);
  iVar1 = decode_jpeg_header((jpeg *)local_3728,1);
  return iVar1;
}

Assistant:

int stbi_jpeg_test_memory(stbi_uc const *buffer, int len)
{
   jpeg j;
   start_mem(&j.s, buffer,len);
   return decode_jpeg_header(&j, SCAN_type);
}